

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderPackingFunctionTests.cpp
# Opt level: O1

TestStatus * __thiscall
vkt::shaderexecutor::PackSnorm4x8CaseInstance::iterate
          (TestStatus *__return_storage_ptr__,PackSnorm4x8CaseInstance *this)

{
  ShaderExecutor *pSVar1;
  deUint32 dVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  long lVar7;
  ulong uVar8;
  int iVar9;
  int iVar10;
  ulong uVar11;
  uint uVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> inputs;
  void *out;
  vector<unsigned_int,_std::allocator<unsigned_int>_> outputs;
  Random rnd;
  void *in;
  TestLog *local_248;
  long lStack_240;
  long local_238;
  PackSnorm4x8CaseInstance *local_228;
  undefined8 local_220;
  int local_218;
  int local_214;
  TestStatus *local_210;
  ulong local_208;
  uint local_200;
  uint local_1fc;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_1f8;
  ulong local_1d8;
  ulong local_1d0;
  deRandom local_1c8;
  undefined1 local_1b8 [8];
  undefined8 uStack_1b0;
  TestLog local_1a8 [13];
  ios_base local_140 [272];
  
  local_210 = __return_storage_ptr__;
  dVar2 = deStringHash((this->super_ShaderPackingFunctionTestInstance).m_name);
  deRandom_init(&local_1c8,dVar2 ^ 0x42f2c0);
  local_238 = 0;
  local_248 = (TestLog *)0x0;
  lStack_240 = 0;
  local_1f8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_1f8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_1f8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  iVar3 = 1;
  if (1 < this->m_precision - PRECISION_MEDIUMP) {
    iVar3 = (uint)(this->m_precision == PRECISION_LOWP) * 2;
  }
  local_1b8 = (undefined1  [8])0x0;
  uStack_1b0._0_1_ = (ostringstream)0x0;
  uStack_1b0._1_7_ = 0;
  local_228 = this;
  std::vector<tcu::Vector<float,4>,std::allocator<tcu::Vector<float,4>>>::
  emplace_back<tcu::Vector<float,4>>
            ((vector<tcu::Vector<float,4>,std::allocator<tcu::Vector<float,4>>> *)&local_248,
             (Vector<float,_4> *)local_1b8);
  local_1b8 = (undefined1  [8])0x3f800000bf800000;
  uStack_1b0._0_1_ = (ostringstream)0x0;
  uStack_1b0._1_7_ = 0x3f800000bf8000;
  std::vector<tcu::Vector<float,4>,std::allocator<tcu::Vector<float,4>>>::
  emplace_back<tcu::Vector<float,4>>
            ((vector<tcu::Vector<float,4>,std::allocator<tcu::Vector<float,4>>> *)&local_248,
             (Vector<float,_4> *)local_1b8);
  local_1b8 = (undefined1  [8])0xbf0000003f000000;
  uStack_1b0._0_1_ = (ostringstream)0x0;
  uStack_1b0._1_7_ = 0x3f000000bf0000;
  std::vector<tcu::Vector<float,4>,std::allocator<tcu::Vector<float,4>>>::
  emplace_back<tcu::Vector<float,4>>
            ((vector<tcu::Vector<float,4>,std::allocator<tcu::Vector<float,4>>> *)&local_248,
             (Vector<float,_4> *)local_1b8);
  local_1b8 = (undefined1  [8])0x3fc00000bfc00000;
  uStack_1b0._0_1_ = (ostringstream)0x0;
  uStack_1b0._1_7_ = 0x3fc00000bfc000;
  std::vector<tcu::Vector<float,4>,std::allocator<tcu::Vector<float,4>>>::
  emplace_back<tcu::Vector<float,4>>
            ((vector<tcu::Vector<float,4>,std::allocator<tcu::Vector<float,4>>> *)&local_248,
             (Vector<float,_4> *)local_1b8);
  local_1b8 = (undefined1  [8])0xbf4000003e800000;
  uStack_1b0 = 0x3f400000be800000;
  std::vector<tcu::Vector<float,4>,std::allocator<tcu::Vector<float,4>>>::
  emplace_back<tcu::Vector<float,4>>
            ((vector<tcu::Vector<float,4>,std::allocator<tcu::Vector<float,4>>> *)&local_248,
             (Vector<float,_4> *)local_1b8);
  iVar9 = 0xf;
  do {
    fVar13 = deRandom_getFloat(&local_1c8);
    fVar14 = deRandom_getFloat(&local_1c8);
    fVar15 = deRandom_getFloat(&local_1c8);
    fVar16 = deRandom_getFloat(&local_1c8);
    local_1b8._4_4_ = fVar14 * 2.5 + -1.25;
    local_1b8._0_4_ = fVar13 * 2.5 + -1.25;
    uStack_1b0 = CONCAT44(fVar16 * 2.5 + -1.25,fVar15 * 2.5 + -1.25);
    std::vector<tcu::Vector<float,4>,std::allocator<tcu::Vector<float,4>>>::
    emplace_back<tcu::Vector<float,4>>
              ((vector<tcu::Vector<float,4>,std::allocator<tcu::Vector<float,4>>> *)&local_248,
               (Vector<float,_4> *)local_1b8);
    iVar9 = iVar9 + -1;
  } while (iVar9 != 0);
  iVar9 = 0x50;
  do {
    fVar13 = deRandom_getFloat(&local_1c8);
    fVar14 = deRandom_getFloat(&local_1c8);
    fVar15 = deRandom_getFloat(&local_1c8);
    fVar16 = deRandom_getFloat(&local_1c8);
    local_1b8._4_4_ = fVar14 * 1e+06 + -500000.0;
    local_1b8._0_4_ = fVar13 * 1e+06 + -500000.0;
    uStack_1b0 = CONCAT44(fVar16 * 1e+06 + -500000.0,fVar15 * 1e+06 + -500000.0);
    std::vector<tcu::Vector<float,4>,std::allocator<tcu::Vector<float,4>>>::
    emplace_back<tcu::Vector<float,4>>
              ((vector<tcu::Vector<float,4>,std::allocator<tcu::Vector<float,4>>> *)&local_248,
               (Vector<float,_4> *)local_1b8);
    iVar9 = iVar9 + -1;
  } while (iVar9 != 0);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize
            (&local_1f8,lStack_240 - (long)local_248 >> 4);
  local_1b8 = (undefined1  [8])
              ((local_228->super_ShaderPackingFunctionTestInstance).m_testCtx)->m_log;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&uStack_1b0);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&uStack_1b0,"Executing shader for ",0x15);
  std::ostream::_M_insert<unsigned_long>((ulong)&uStack_1b0);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&uStack_1b0," input values",0xd);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_1b8,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&uStack_1b0);
  std::ios_base::~ios_base(local_140);
  local_1b8 = (undefined1  [8])local_248;
  local_220 = (deUint64)
              local_1f8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_start;
  pSVar1 = (local_228->super_ShaderPackingFunctionTestInstance).m_executor.
           super_UniqueBase<vkt::shaderexecutor::ShaderExecutor,_de::DefaultDeleter<vkt::shaderexecutor::ShaderExecutor>_>
           .m_data.ptr;
  (*pSVar1->_vptr_ShaderExecutor[2])
            (pSVar1,(ulong)(lStack_240 - (long)local_248) >> 4,local_1b8,&local_220,0);
  local_208 = (ulong)(lStack_240 - (long)local_248) >> 4;
  uVar11 = 0;
  if (0 < (int)(uint)local_208) {
    local_1d0 = (ulong)((uint)local_208 & 0x7fffffff);
    lVar7 = 0;
    uVar8 = 0;
    uVar11 = 0;
    do {
      fVar13 = *(float *)((long)&local_248->m_log + lVar7);
      fVar14 = 1.0;
      if (fVar13 <= 1.0) {
        fVar14 = fVar13;
      }
      fVar14 = (float)(-(uint)(fVar13 < -1.0) & 0xc2fe0000 |
                      ~-(uint)(fVar13 < -1.0) & (uint)(fVar14 * 127.0));
      uVar12 = -(uint)(fVar14 < 0.0);
      fVar14 = (float)(~uVar12 & 0x3f000000 | uVar12 & 0xbf000000) + fVar14;
      fVar13 = -128.0;
      if (-128.0 <= fVar14) {
        fVar13 = fVar14;
      }
      fVar14 = 127.0;
      if (fVar13 <= 127.0) {
        fVar14 = fVar13;
      }
      fVar13 = *(float *)((long)&local_248->m_log + lVar7 + 4);
      fVar15 = 1.0;
      if (fVar13 <= 1.0) {
        fVar15 = fVar13;
      }
      fVar15 = (float)(-(uint)(fVar13 < -1.0) & 0xc2fe0000 |
                      ~-(uint)(fVar13 < -1.0) & (uint)(fVar15 * 127.0));
      uVar12 = -(uint)(fVar15 < 0.0);
      fVar15 = (float)(~uVar12 & 0x3f000000 | uVar12 & 0xbf000000) + fVar15;
      fVar13 = -128.0;
      if (-128.0 <= fVar15) {
        fVar13 = fVar15;
      }
      fVar15 = 127.0;
      if (fVar13 <= 127.0) {
        fVar15 = fVar13;
      }
      local_1fc = (int)fVar15 & 0xff;
      fVar13 = *(float *)((long)&local_248[1].m_log + lVar7);
      fVar15 = 1.0;
      if (fVar13 <= 1.0) {
        fVar15 = fVar13;
      }
      fVar15 = (float)(-(uint)(fVar13 < -1.0) & 0xc2fe0000 |
                      ~-(uint)(fVar13 < -1.0) & (uint)(fVar15 * 127.0));
      uVar12 = -(uint)(fVar15 < 0.0);
      fVar15 = (float)(~uVar12 & 0x3f000000 | uVar12 & 0xbf000000) + fVar15;
      fVar13 = -128.0;
      if (-128.0 <= fVar15) {
        fVar13 = fVar15;
      }
      fVar15 = 127.0;
      if (fVar13 <= 127.0) {
        fVar15 = fVar13;
      }
      fVar13 = *(float *)((long)&local_248[1].m_log + lVar7 + 4);
      fVar16 = 1.0;
      if (fVar13 <= 1.0) {
        fVar16 = fVar13;
      }
      fVar16 = (float)(-(uint)(fVar13 < -1.0) & 0xc2fe0000 |
                      ~-(uint)(fVar13 < -1.0) & (uint)(fVar16 * 127.0));
      uVar12 = -(uint)(fVar16 < 0.0);
      fVar16 = (float)(~uVar12 & 0x3f000000 | uVar12 & 0xbf000000) + fVar16;
      fVar13 = -128.0;
      if (-128.0 <= fVar16) {
        fVar13 = fVar16;
      }
      fVar16 = 127.0;
      if (fVar13 <= 127.0) {
        fVar16 = fVar13;
      }
      local_200 = (uint)fVar16;
      uVar12 = local_1f8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_start[uVar8];
      iVar10 = ((int)fVar14 & 0xffU) - (uVar12 & 0xff);
      iVar9 = -iVar10;
      if (0 < iVar10) {
        iVar9 = iVar10;
      }
      iVar5 = local_1fc - (uVar12 >> 8 & 0xff);
      iVar10 = -iVar5;
      if (0 < iVar5) {
        iVar10 = iVar5;
      }
      iVar6 = ((int)fVar15 & 0xffU) - (uVar12 >> 0x10 & 0xff);
      iVar5 = -iVar6;
      if (0 < iVar6) {
        iVar5 = iVar6;
      }
      iVar4 = (local_200 & 0xff) - (uVar12 >> 0x18);
      iVar6 = -iVar4;
      if (0 < iVar4) {
        iVar6 = iVar4;
      }
      if ((((iVar3 < iVar9) || (iVar3 < iVar10)) || (iVar3 < iVar5)) || (iVar3 < iVar6)) {
        if ((int)uVar11 < 10) {
          local_1b8 = (undefined1  [8])
                      ((local_228->super_ShaderPackingFunctionTestInstance).m_testCtx)->m_log;
          local_1d8 = uVar11;
          std::__cxx11::ostringstream::ostringstream((ostringstream *)&uStack_1b0);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&uStack_1b0,"ERROR: Mismatch in value ",0x19);
          std::ostream::operator<<(&uStack_1b0,(int)uVar8);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&uStack_1b0,", expected packSnorm4x8(",0x18);
          tcu::operator<<((ostream *)&uStack_1b0,
                          (Vector<float,_4> *)((long)&local_248->m_log + lVar7));
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&uStack_1b0,") = ",4);
          local_220 = (deUint64)
                      ((local_1fc << 8 | ((int)fVar15 & 0xffU) << 0x10 | local_200 << 0x18) +
                      ((int)fVar14 & 0xffU));
          tcu::Format::Hex<8UL>::toStream((Hex<8UL> *)&local_220,(ostream *)&uStack_1b0);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&uStack_1b0,", got ",6);
          local_220 = (ulong)uVar12;
          tcu::Format::Hex<8UL>::toStream((Hex<8UL> *)&local_220,(ostream *)&uStack_1b0);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&uStack_1b0,"\n  diffs = ",0xb);
          local_220._4_4_ = iVar10;
          local_220._0_4_ = iVar9;
          local_218 = iVar5;
          local_214 = iVar6;
          tcu::operator<<((ostream *)&uStack_1b0,(Vector<int,_4> *)&local_220);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&uStack_1b0,", max diff = ",0xd);
          std::ostream::operator<<((ostream *)&uStack_1b0,iVar3);
          tcu::MessageBuilder::operator<<
                    ((MessageBuilder *)local_1b8,(EndMessageToken *)&tcu::TestLog::EndMessage);
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)&uStack_1b0);
          std::ios_base::~ios_base(local_140);
          uVar11 = local_1d8;
        }
        else if ((int)uVar11 == 10) {
          local_1b8 = (undefined1  [8])
                      ((local_228->super_ShaderPackingFunctionTestInstance).m_testCtx)->m_log;
          std::__cxx11::ostringstream::ostringstream((ostringstream *)&uStack_1b0);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&uStack_1b0,"...",3);
          tcu::MessageBuilder::operator<<
                    ((MessageBuilder *)local_1b8,(EndMessageToken *)&tcu::TestLog::EndMessage);
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)&uStack_1b0);
          std::ios_base::~ios_base(local_140);
        }
        uVar11 = (ulong)((int)uVar11 + 1);
      }
      uVar8 = uVar8 + 1;
      lVar7 = lVar7 + 0x10;
    } while (local_1d0 != uVar8);
  }
  local_1b8 = (undefined1  [8])
              ((local_228->super_ShaderPackingFunctionTestInstance).m_testCtx)->m_log;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&uStack_1b0);
  std::ostream::operator<<((ostringstream *)&uStack_1b0,(int)local_208 - (int)uVar11);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&uStack_1b0," / ",3);
  std::ostream::operator<<((ostringstream *)&uStack_1b0,(int)local_208);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&uStack_1b0," values passed",0xe);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_1b8,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&uStack_1b0);
  std::ios_base::~ios_base(local_140);
  local_1b8 = (undefined1  [8])local_1a8;
  if ((int)uVar11 == 0) {
    std::__cxx11::string::_M_construct<char_const*>((string *)local_1b8,"Pass","");
    local_210->m_code = QP_TEST_RESULT_PASS;
    (local_210->m_description)._M_dataplus._M_p = (pointer)&(local_210->m_description).field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_210->m_description,local_1b8,
               (long)(qpTestLog **)local_1b8 + uStack_1b0);
  }
  else {
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_1b8,"Result comparison failed","");
    local_210->m_code = QP_TEST_RESULT_FAIL;
    (local_210->m_description)._M_dataplus._M_p = (pointer)&(local_210->m_description).field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_210->m_description,local_1b8,
               (long)(qpTestLog **)local_1b8 + uStack_1b0);
  }
  if (local_1b8 != (undefined1  [8])local_1a8) {
    operator_delete((void *)local_1b8,(ulong)((long)&(local_1a8[0].m_log)->flags + 1));
  }
  if (local_1f8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_1f8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_1f8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_1f8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  if (local_248 != (TestLog *)0x0) {
    operator_delete(local_248,local_238 - (long)local_248);
  }
  return local_210;
}

Assistant:

tcu::TestStatus iterate (void)
	{
		de::Random					rnd			(deStringHash(m_name) ^ 0x42f2c0);
		std::vector<tcu::Vec4>		inputs;
		std::vector<deUint32>		outputs;
		const int					maxDiff		= m_precision == glu::PRECISION_HIGHP	? 1	:		// Rounding only.
												  m_precision == glu::PRECISION_MEDIUMP	? 1	:		// (2^-10) * (2^7) + 1
												  m_precision == glu::PRECISION_LOWP	? 2	: 0;	// (2^-8) * (2^7) + 1

		// Special values to check.
		inputs.push_back(tcu::Vec4(0.0f, 0.0f, 0.0f, 0.0f));
		inputs.push_back(tcu::Vec4(-1.0f, 1.0f, -1.0f, 1.0f));
		inputs.push_back(tcu::Vec4(0.5f, -0.5f, -0.5f, 0.5f));
		inputs.push_back(tcu::Vec4(-1.5f, 1.5f, -1.5f, 1.5f));
		inputs.push_back(tcu::Vec4(0.25f, -0.75f, -0.25f, 0.75f));

		// Random values, mostly in range.
		for (int ndx = 0; ndx < 15; ndx++)
		{
			const float x = rnd.getFloat()*2.5f - 1.25f;
			const float y = rnd.getFloat()*2.5f - 1.25f;
			const float z = rnd.getFloat()*2.5f - 1.25f;
			const float w = rnd.getFloat()*2.5f - 1.25f;
			inputs.push_back(tcu::Vec4(x, y, z, w));
		}

		// Large random values.
		for (int ndx = 0; ndx < 80; ndx++)
		{
			const float x = rnd.getFloat()*1e6f - 0.5e6f;
			const float y = rnd.getFloat()*1e6f - 0.5e6f;
			const float z = rnd.getFloat()*1e6f - 0.5e6f;
			const float w = rnd.getFloat()*1e6f - 0.5e6f;
			inputs.push_back(tcu::Vec4(x, y, z, w));
		}

		outputs.resize(inputs.size());

		m_testCtx.getLog() << TestLog::Message << "Executing shader for " << inputs.size() << " input values" << tcu::TestLog::EndMessage;

		{
			const void*	in	= &inputs[0];
			void*		out	= &outputs[0];

			m_executor->execute((int)inputs.size(), &in, &out);
		}

		// Verify
		{
			const int	numValues	= (int)inputs.size();
			const int	maxPrints	= 10;
			int			numFailed	= 0;

			for (int valNdx = 0; valNdx < numValues; valNdx++)
			{
				const deUint16	ref0	= (deUint8)de::clamp(deRoundFloatToInt32(de::clamp(inputs[valNdx].x(), -1.0f, 1.0f) * 127.0f), -(1<<7), (1<<7)-1);
				const deUint16	ref1	= (deUint8)de::clamp(deRoundFloatToInt32(de::clamp(inputs[valNdx].y(), -1.0f, 1.0f) * 127.0f), -(1<<7), (1<<7)-1);
				const deUint16	ref2	= (deUint8)de::clamp(deRoundFloatToInt32(de::clamp(inputs[valNdx].z(), -1.0f, 1.0f) * 127.0f), -(1<<7), (1<<7)-1);
				const deUint16	ref3	= (deUint8)de::clamp(deRoundFloatToInt32(de::clamp(inputs[valNdx].w(), -1.0f, 1.0f) * 127.0f), -(1<<7), (1<<7)-1);
				const deUint32	ref		= (deUint32(ref3) << 24) | (deUint32(ref2) << 16) | (deUint32(ref1) << 8) | deUint32(ref0);
				const deUint32	res		= outputs[valNdx];
				const deUint16	res0	= (deUint8)(res & 0xff);
				const deUint16	res1	= (deUint8)((res >> 8) & 0xff);
				const deUint16	res2	= (deUint8)((res >> 16) & 0xff);
				const deUint16	res3	= (deUint8)((res >> 24) & 0xff);
				const int		diff0	= de::abs((int)ref0 - (int)res0);
				const int		diff1	= de::abs((int)ref1 - (int)res1);
				const int		diff2	= de::abs((int)ref2 - (int)res2);
				const int		diff3	= de::abs((int)ref3 - (int)res3);

				if (diff0 > maxDiff || diff1 > maxDiff || diff2 > maxDiff || diff3 > maxDiff)
				{
					if (numFailed < maxPrints)
					{
						m_testCtx.getLog() << TestLog::Message << "ERROR: Mismatch in value " << valNdx
															   << ", expected packSnorm4x8(" << inputs[valNdx] << ") = " << tcu::toHex(ref)
															   << ", got " << tcu::toHex(res)
															   << "\n  diffs = " << tcu::IVec4(diff0, diff1, diff2, diff3) << ", max diff = " << maxDiff
										   << TestLog::EndMessage;
					}
					else if (numFailed == maxPrints)
						m_testCtx.getLog() << TestLog::Message << "..." << TestLog::EndMessage;

					numFailed += 1;
				}
			}

			m_testCtx.getLog() << TestLog::Message << (numValues - numFailed) << " / " << numValues << " values passed" << TestLog::EndMessage;

			if (numFailed == 0)
				return tcu::TestStatus::pass("Pass");
			else
				return tcu::TestStatus::fail("Result comparison failed");

		}
	}